

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool readSolutionFileIdIgnoreLineOk(string *id,ifstream *in_file)

{
  uint uVar1;
  
  uVar1 = *(uint *)(&(in_file->super_basic_istream<char,_std::char_traits<char>_>).field_0x20 +
                   (long)(in_file->super_basic_istream<char,_std::char_traits<char>_>).
                         _vptr_basic_istream[-3]);
  if ((uVar1 & 2) == 0) {
    std::operator>>(&in_file->super_basic_istream<char,_std::char_traits<char>_>,(string *)id);
    std::istream::ignore((long)in_file,0x50);
  }
  return (uVar1 & 2) == 0;
}

Assistant:

bool readSolutionFileIdIgnoreLineOk(std::string& id, std::ifstream& in_file) {
  if (in_file.eof()) return false;
  in_file >> id;  // Id
  in_file.ignore(kMaxLineLength, '\n');
  return true;
}